

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_bigint<std::allocator<unsigned_char>>::
write_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_bigint<std::allocator<unsigned_char>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  pointer pcVar1;
  uint64_t *puVar2;
  char *pcVar3;
  pointer pcVar4;
  char cVar5;
  uint64_t uVar6;
  ulong uVar7;
  bool bVar8;
  basic_bigint<std::allocator<unsigned_char>_> v;
  basic_bigint<std::allocator<unsigned_char>_> R;
  basic_bigint<std::allocator<unsigned_char>_> LP10;
  basic_bigint<std::allocator<unsigned_char>_> bStack_d8;
  basic_bigint<std::allocator<unsigned_char>> *local_b0;
  basic_bigint<std::allocator<unsigned_char>_> local_a8;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> local_58;
  
  local_b0 = this;
  basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
            (&bStack_d8,(basic_bigint<std::allocator<unsigned_char>_> *)this);
  std::__cxx11::string::reserve((ulong)data);
  cVar5 = (char)data;
  if (bStack_d8.field_0.common_stor_.length_ == 0) {
    std::__cxx11::string::push_back(cVar5);
  }
  else {
    if (basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 == 1) {
      uVar7 = 1;
      do {
        basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 = uVar7 * 10;
        basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 =
             basic_bigint<std::allocator<unsigned_char>_>::
             write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 + 1;
        bVar8 = uVar7 < 0x28f5c28f5c28f5d;
        uVar7 = basic_bigint<std::allocator<unsigned_char>_>::
                write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10;
      } while (bVar8);
    }
    local_a8.field_0._0_1_ = 0;
    local_a8.field_0.common_stor_.length_ = 0;
    local_a8.field_0.short_stor_.values_[0] = 0;
    local_a8.field_0.short_stor_.values_[1] = 0;
    local_80.field_0._0_1_ = 0;
    local_80.field_0.common_stor_.length_ =
         (size_type)
         (basic_bigint<std::allocator<unsigned_char>_>::
          write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 != 0);
    local_80.field_0.short_stor_.values_[1] = 0;
    local_80.field_0.short_stor_.values_[0] =
         basic_bigint<std::allocator<unsigned_char>_>::
         write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10;
    do {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint(&local_58,&local_80);
      basic_bigint<std::allocator<unsigned_char>_>::divide
                (&bStack_d8,&local_58,&bStack_d8,&local_a8,true);
      if (((local_58.field_0._0_1_ & 1) != 0) &&
         ((pointer)local_58.field_0.short_stor_.values_[1] != (pointer)0x0)) {
        operator_delete(local_58.field_0.dynamic_stor_.data_,
                        local_58.field_0.short_stor_.values_[0] << 3);
      }
      if (local_a8.field_0.common_stor_.length_ == 0) {
        uVar6 = 0;
      }
      else {
        puVar2 = basic_bigint<std::allocator<unsigned_char>_>::data(&local_a8);
        uVar6 = *puVar2;
      }
      if (basic_bigint<std::allocator<unsigned_char>_>::
          write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 != 0) {
        uVar7 = 0;
        do {
          uVar6 = uVar6 / 10;
          std::__cxx11::string::push_back(cVar5);
          if (uVar6 + bStack_d8.field_0.common_stor_.length_ == 0) break;
          uVar7 = uVar7 + 1;
        } while (uVar7 < basic_bigint<std::allocator<unsigned_char>_>::
                         write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10);
      }
    } while (bStack_d8.field_0.common_stor_.length_ != 0);
    if (((byte)local_b0[8] & 2) != 0) {
      std::__cxx11::string::push_back(cVar5);
    }
    pcVar1 = (data->_M_dataplus)._M_p;
    pcVar4 = pcVar1 + (data->_M_string_length - 1);
    if (pcVar1 < pcVar4 && data->_M_string_length != 0) {
      do {
        pcVar3 = pcVar1 + 1;
        cVar5 = *pcVar1;
        *pcVar1 = *pcVar4;
        *pcVar4 = cVar5;
        pcVar4 = pcVar4 + -1;
        pcVar1 = pcVar3;
      } while (pcVar3 < pcVar4);
    }
    if (((local_80.field_0._0_1_ & 1) != 0) &&
       ((pointer)local_80.field_0.short_stor_.values_[1] != (pointer)0x0)) {
      operator_delete(local_80.field_0.dynamic_stor_.data_,
                      local_80.field_0.short_stor_.values_[0] << 3);
    }
    if (((local_a8.field_0._0_1_ & 1) != 0) &&
       ((pointer)local_a8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
      operator_delete(local_a8.field_0.dynamic_stor_.data_,
                      local_a8.field_0.short_stor_.values_[0] << 3);
    }
  }
  if (((bStack_d8.field_0._0_1_ & 1) != 0) &&
     ((pointer)bStack_d8.field_0.short_stor_.values_[1] != (pointer)0x0)) {
    operator_delete(bStack_d8.field_0.dynamic_stor_.data_,
                    bStack_d8.field_0.short_stor_.values_[0] << 3);
  }
  return;
}

Assistant:

void write_string(std::basic_string<Ch,Traits,Alloc>& data) const
    {
        basic_bigint<Allocator> v(*this);

        std::size_t len = (v.length() * basic_type_bits / 3) + 2;
        data.reserve(len);

        static uint64_t p10 = 1;
        static uint64_t ip10 = 0;

        if ( v.length() == 0 )
        {
            data.push_back('0');
        }
        else
        {
            uint64_t r;
            if ( p10 == 1 )
            {
                while ( p10 <= max_uint64_div_10)
                {
                    p10 *= 10u;
                    ip10++;
                }
            }                     
            // p10 is max unsigned power of 10
            basic_bigint<Allocator> R;
            basic_bigint<Allocator> LP10 = p10; // LP10 = p10 = ::pow(10, ip10)

            do
            {
                v.divide( LP10, v, R, true );
                r = (R.length() ? R.data()[0] : 0);
                for ( size_type j=0; j < ip10; j++ )
                {
                    data.push_back(char(r % 10u + '0'));
                    r /= 10u;
                    if ( r + v.length() == 0 )
                        break;
                }
            } 
            while ( v.length() );
            if (is_negative())
            {
                data.push_back('-');
            }
            std::reverse(data.begin(),data.end());
        }
    }